

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O1

sunrealtype ** SUNDlsMat_newBandMat(sunindextype n,sunindextype smu,sunindextype ml)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  sunrealtype **__ptr;
  sunrealtype *psVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ulong uVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  uint uVar9;
  
  if ((0 < n) && (__ptr = (sunrealtype **)malloc(n * 8), __ptr != (sunrealtype **)0x0)) {
    uVar6 = ml + smu + 1;
    *__ptr = (sunrealtype *)0x0;
    psVar3 = (sunrealtype *)malloc(n * uVar6 * 8);
    *__ptr = psVar3;
    auVar2 = _DAT_0010c050;
    auVar1 = _DAT_0010c040;
    if (psVar3 != (sunrealtype *)0x0) {
      if (n == 1) {
        return __ptr;
      }
      lVar5 = n + -2;
      auVar7._8_4_ = (int)lVar5;
      auVar7._0_8_ = lVar5;
      auVar7._12_4_ = (int)((ulong)lVar5 >> 0x20);
      uVar9 = (uint)(uVar6 >> 0x20);
      auVar8._8_4_ = (int)uVar6;
      auVar8._0_8_ = uVar6;
      auVar8._12_4_ = uVar9;
      uVar10 = 1;
      uVar11 = 2;
      uVar4 = 0;
      auVar7 = auVar7 ^ _DAT_0010c050;
      do {
        auVar12._8_4_ = (int)uVar4;
        auVar12._0_8_ = uVar4;
        auVar12._12_4_ = (int)(uVar4 >> 0x20);
        auVar12 = (auVar12 | auVar1) ^ auVar2;
        psVar3 = *__ptr;
        if ((bool)(~(auVar12._4_4_ == auVar7._4_4_ && auVar7._0_4_ < auVar12._0_4_ ||
                    auVar7._4_4_ < auVar12._4_4_) & 1)) {
          __ptr[uVar4 + 1] =
               psVar3 + (uVar10 & 0xffffffff) * (uVar6 & 0xffffffff) +
                        ((uVar10 & 0xffffffff) * (ulong)uVar9 +
                         (uVar10 >> 0x20) * (uVar6 & 0xffffffff) << 0x20);
        }
        if ((auVar12._12_4_ != auVar7._12_4_ || auVar12._8_4_ <= auVar7._8_4_) &&
            auVar12._12_4_ <= auVar7._12_4_) {
          __ptr[uVar4 + 2] =
               psVar3 + (uVar11 & 0xffffffff) * (uVar6 & 0xffffffff) +
                        ((uVar11 & 0xffffffff) * (auVar8._8_8_ >> 0x20) +
                         (uVar11 >> 0x20) * (uVar6 & 0xffffffff) << 0x20);
        }
        uVar4 = uVar4 + 2;
        uVar10 = uVar10 + 2;
        uVar11 = uVar11 + 2;
      } while ((n & 0x7ffffffffffffffeU) != uVar4);
      return __ptr;
    }
    free(__ptr);
  }
  return (sunrealtype **)0x0;
}

Assistant:

sunrealtype** SUNDlsMat_newBandMat(sunindextype n, sunindextype smu,
                                   sunindextype ml)
{
  sunrealtype** a;
  sunindextype j, colSize;

  if (n <= 0) { return (NULL); }

  a = NULL;
  a = (sunrealtype**)malloc(n * sizeof(sunrealtype*));
  if (a == NULL) { return (NULL); }

  colSize = smu + ml + 1;
  a[0]    = NULL;
  a[0]    = (sunrealtype*)malloc(n * colSize * sizeof(sunrealtype));
  if (a[0] == NULL)
  {
    free(a);
    a = NULL;
    return (NULL);
  }

  for (j = 1; j < n; j++) { a[j] = a[0] + j * colSize; }

  return (a);
}